

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_traits.h
# Opt level: O1

void cppcms::details::
     archive_save_container<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *v,archive *a)

{
  pointer pbVar1;
  long local_20;
  
  local_20 = (long)(v->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(v->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5;
  cppcms::archive::write_chunk(a,(ulong)&local_20);
  for (pbVar1 = (v->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar1 != (v->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; pbVar1 = pbVar1 + 1) {
    cppcms::archive::write_chunk(a,(ulong)(pbVar1->_M_dataplus)._M_p);
  }
  return;
}

Assistant:

void archive_save_container(T const &v,archive &a)
		{
			typename T::const_iterator it;
			typedef typename T::value_type value_type;
			size_t n=v.size();
			archive_traits<size_t>::save(n,a);
			for(it=v.begin();it!=v.end();++it) {
				archive_traits<value_type>::save(*it,a);
			}
		}